

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

string * __thiscall
deqp::gls::ShaderExecUtil::TessControlExecutor::generateTessControlShader_abi_cxx11_
          (string *__return_storage_ptr__,TessControlExecutor *this,ShaderSpec *shaderSpec)

{
  pointer ppSVar1;
  bool bVar2;
  char *__s;
  size_t sVar3;
  ostream *poVar4;
  int ndx;
  int iVar5;
  ostringstream src;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __s = glu::getGLSLVersionDeclaration
                  (*(GLSLVersion *)
                    &(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor);
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  bVar2 = glu::glslVersionIsES
                    (*(GLSLVersion *)
                      &(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor);
  if (bVar2 && *(int *)&(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor < 3
     ) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  }
  ppSVar1 = (this->super_BufferIoExecutor).m_program.m_shaders[0].
            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (char *)(this->super_BufferIoExecutor).super_ShaderExecutor.m_outputs.
                                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)ppSVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nlayout(vertices = 1) out;\n\n",0x1c);
  BufferIoExecutor::declareBufferBlocks((ostream *)local_1a8,(ShaderSpec *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"void main (void)\n{\n",0x13);
  iVar5 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_TessLevelInner[",0x13);
    poVar4 = (ostream *)std::ostream::operator<<(local_1a8,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = 1.0;\n",9);
    iVar5 = iVar5 + 1;
  } while (iVar5 == 1);
  iVar5 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_TessLevelOuter[",0x13);
    poVar4 = (ostream *)std::ostream::operator<<(local_1a8,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = 1.0;\n",9);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\thighp uint invocationId = uint(gl_PrimitiveID);\n",0x31);
  BufferIoExecutor::generateExecBufferIo((ostream *)local_1a8,(ShaderSpec *)this,"invocationId");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string TessControlExecutor::generateTessControlShader (const ShaderSpec& shaderSpec)
{
	std::ostringstream src;

	src << glu::getGLSLVersionDeclaration(shaderSpec.version) << "\n";

	if (glu::glslVersionIsES(shaderSpec.version) && shaderSpec.version <= glu::GLSL_VERSION_310_ES)
		src << "#extension GL_EXT_tessellation_shader : require\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	src << "\nlayout(vertices = 1) out;\n\n";

	declareBufferBlocks(src, shaderSpec);

	src << "void main (void)\n{\n";

	for (int ndx = 0; ndx < 2; ndx++)
		src << "\tgl_TessLevelInner[" << ndx << "] = 1.0;\n";

	for (int ndx = 0; ndx < 4; ndx++)
		src << "\tgl_TessLevelOuter[" << ndx << "] = 1.0;\n";

	src << "\n"
		<< "\thighp uint invocationId = uint(gl_PrimitiveID);\n";

	generateExecBufferIo(src, shaderSpec, "invocationId");

	src << "}\n";

	return src.str();
}